

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall gmlc::networking::TcpConnection::waitOnClose(TcpConnection *this)

{
  mutex *__mutex;
  impl_type *piVar1;
  bool bVar2;
  ostream *poVar3;
  stringstream str;
  string local_1e0;
  TriggerVariable *local_1c0;
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (((this->triggerhalt)._M_base._M_i & 1U) == 0) {
    closeNoWait(this);
    waitOnClose(this);
  }
  else {
    if (this->connecting == true) {
      concurrency::TriggerVariable::waitActivation(&this->connected);
    }
    local_1c0 = &this->receivingHalt;
    local_1b8[0] = 200;
    bVar2 = concurrency::TriggerVariable::wait_for(local_1c0,(milliseconds *)local_1b8);
    if (!bVar2) {
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"wait timeout ",0xd);
        poVar3 = (ostream *)std::ostream::operator<<(local_1a8,(this->state)._M_i);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        (*((this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_Socket[8])();
        poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::ostream::_M_insert<bool>(SUB81(poVar3,0));
        std::__cxx11::stringbuf::str();
        logger(this,1,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + (int)(stringstream *)local_1b8)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"wait info ",10);
        piVar1 = this->context_->impl_;
        if ((piVar1->mutex_).enabled_ != false) {
          __mutex = &(piVar1->mutex_).mutex_;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        poVar3 = std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::ostream::_M_insert<bool>(SUB81(poVar3,0));
        std::__cxx11::stringbuf::str();
        logger(this,1,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        local_1b8[0] = 200;
        bVar2 = concurrency::TriggerVariable::wait_for(local_1c0,(milliseconds *)local_1b8);
      } while (!bVar2);
    }
  }
  LOCK();
  (this->state)._M_i = CLOSED;
  UNLOCK();
  return;
}

Assistant:

void TcpConnection::waitOnClose()
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        if (connecting) {
            connected.waitActivation();
        }

        while (!receivingHalt.wait_for(std::chrono::milliseconds(200))) {
            std::stringstream str;
            str << "wait timeout " << static_cast<int>(state.load()) << " "
                << socket_->is_open() << " " << receivingHalt.isTriggered();
            logger(1, str.str());
            str.clear();

            str << "wait info " << context_.stopped() << " " << connecting;
            logger(1, str.str());
        }
    } else {
        close();
    }
    state.store(ConnectionStates::CLOSED);
}